

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<float>
          (internal *this,char *lhs_expression,char *rhs_expression,float lhs_value,float rhs_value)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  stringstream rhs_ss;
  stringstream lhs_ss;
  FloatingPointUnion local_370;
  FloatingPointUnion local_36c;
  string local_368;
  string local_348;
  stringstream local_328 [16];
  long local_318;
  undefined8 auStack_310 [46];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 auStack_188 [46];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_370.value_ = rhs_value;
  local_36c.value_ = lhs_value;
  bVar1 = FloatingPoint<float>::AlmostEquals
                    ((FloatingPoint<float> *)&local_36c,(FloatingPoint<float> *)&local_370);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    *(undefined8 *)((long)auStack_188 + *(long *)(local_190 + -0x18)) = 8;
    std::ostream::operator<<(&local_190,lhs_value);
    std::__cxx11::stringstream::stringstream(local_328);
    *(undefined8 *)((long)auStack_310 + *(long *)(local_318 + -0x18)) = 8;
    std::ostream::operator<<(&local_318,rhs_value);
    StringStreamToString(&local_348,(stringstream *)local_1a0);
    StringStreamToString(&local_368,(stringstream *)local_328);
    EqFailure(this,lhs_expression,rhs_expression,&local_348,&local_368,false);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::stringstream::~stringstream(local_328);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* lhs_expression,
                                         const char* rhs_expression,
                                         RawType lhs_value,
                                         RawType rhs_value) {
  const FloatingPoint<RawType> lhs(lhs_value), rhs(rhs_value);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream lhs_ss;
  lhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << lhs_value;

  ::std::stringstream rhs_ss;
  rhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << rhs_value;

  return EqFailure(lhs_expression,
                   rhs_expression,
                   StringStreamToString(&lhs_ss),
                   StringStreamToString(&rhs_ss),
                   false);
}